

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O2

REF_STATUS
ref_import_bin_ugrid_bound_tag
          (REF_CELL ref_cell,REF_INT ncell,FILE *file,REF_BOOL swap,REF_BOOL fat)

{
  int iVar1;
  ulong uVar2;
  REF_INT *chunk;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int n;
  
  if (0 < ncell) {
    iVar1 = ref_cell->node_per;
    uVar2 = 1000000;
    if ((uint)ncell < 1000000) {
      uVar2 = (ulong)(uint)ncell;
    }
    chunk = (REF_INT *)malloc((ulong)(uint)((int)uVar2 * 4));
    if (chunk == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x210,"ref_import_bin_ugrid_bound_tag","malloc tag of REF_INT NULL");
      return 2;
    }
    for (iVar5 = 0; uVar6 = ncell - iVar5, uVar6 != 0 && iVar5 <= ncell; iVar5 = iVar5 + n) {
      uVar4 = (ulong)uVar6;
      if ((int)uVar2 < (int)uVar6) {
        uVar4 = uVar2;
      }
      n = (int)uVar4;
      uVar6 = ref_import_bin_ugrid_chunk(file,swap,fat,n,chunk);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x214,"ref_import_bin_ugrid_bound_tag",(ulong)uVar6,"tag");
        return uVar6;
      }
      uVar3 = 0;
      if (0 < n) {
        uVar3 = uVar4;
      }
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        ref_cell->c2n[(long)(iVar5 + (int)uVar4) * (long)ref_cell->size_per + (long)iVar1] =
             chunk[uVar4];
      }
    }
    free(chunk);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_import_bin_ugrid_bound_tag(
    REF_CELL ref_cell, REF_INT ncell, FILE *file, REF_BOOL swap, REF_BOOL fat) {
  REF_INT node_per, max_chunk, nread, chunk, cell;
  REF_INT *tag;

  if (0 < ncell) {
    node_per = ref_cell_node_per(ref_cell);
    max_chunk = MIN(1000000, ncell);
    ref_malloc(tag, max_chunk, REF_INT);
    nread = 0;
    while (nread < ncell) {
      chunk = MIN(max_chunk, ncell - nread);
      RSS(ref_import_bin_ugrid_chunk(file, swap, fat, chunk, tag), "tag");
      for (cell = 0; cell < chunk; cell++) {
        ref_cell_c2n(ref_cell, node_per, nread + cell) = tag[cell];
      }
      nread += chunk;
    }
    ref_free(tag);
  }

  return REF_SUCCESS;
}